

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void reset_ts(TCGTemp *ts)

{
  tcg_temp_info *ptVar1;
  tcg_temp_info *ptVar2;
  tcg_temp_info *ptVar3;
  tcg_temp_info *ni;
  tcg_temp_info *pi;
  tcg_temp_info *ti;
  TCGTemp *ts_local;
  
  ptVar1 = ts_info(ts);
  ptVar2 = ts_info(ptVar1->prev_copy);
  ptVar3 = ts_info(ptVar1->next_copy);
  ptVar3->prev_copy = ptVar1->prev_copy;
  ptVar2->next_copy = ptVar1->next_copy;
  ptVar1->next_copy = ts;
  ptVar1->prev_copy = ts;
  ptVar1->is_const = false;
  ptVar1->mask = 0xffffffffffffffff;
  return;
}

Assistant:

static void reset_ts(TCGTemp *ts)
{
    struct tcg_temp_info *ti = ts_info(ts);
    struct tcg_temp_info *pi = ts_info(ti->prev_copy);
    struct tcg_temp_info *ni = ts_info(ti->next_copy);

    ni->prev_copy = ti->prev_copy;
    pi->next_copy = ti->next_copy;
    ti->next_copy = ts;
    ti->prev_copy = ts;
    ti->is_const = false;
    ti->mask = -1;
}